

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O2

int __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::closer
          (miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *this,UI *ui)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int extraout_EAX;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar4;
  
  uVar4 = *(ulong *)ui;
  for (uVar5 = 0; (ulong)uVar5 < (ulong)((long)(*(long *)(ui + 8) - uVar4) >> 2); uVar5 = uVar5 + 1)
  {
    uVar6 = (ulong)(this->order).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar5];
    uVar3 = *(uint *)(uVar4 + uVar6 * 4);
    uVar1 = (this->best_spec)._s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6];
    if (uVar3 != uVar1) {
      uVar2 = -uVar3;
      if (0 < (int)uVar3) {
        uVar2 = uVar3;
      }
      uVar7 = -uVar1;
      if (0 < (int)uVar1) {
        uVar7 = uVar1;
      }
      if (uVar7 < uVar2) goto LAB_00109b00;
      if (uVar2 == uVar7) {
        if ((int)uVar1 < (int)uVar3) goto LAB_00109b00;
        if ((int)uVar3 < (int)uVar1) goto LAB_00109b0f;
      }
      else if (uVar2 < uVar7) goto LAB_00109b0f;
    }
  }
  uVar5 = transformation_costs(this,&this->transforms);
  uVar3 = transformation_costs(this,&this->best_transforms);
  uVar4 = (ulong)uVar3;
  if (uVar3 <= uVar5) {
LAB_00109b0f:
    return (int)uVar4;
  }
LAB_00109b00:
  update_best(this,(spectrum *)ui);
  return extraout_EAX;
}

Assistant:

void closer( spectrum& lspec )
  {
    for ( auto i = 0u; i < lspec.size(); ++i )
    {
      const auto j = order[i];
      if ( lspec[j] == best_spec[j] )
      {
        continue;
      }
      if ( abs( lspec[j] ) > abs( best_spec[j] ) ||
           ( abs( lspec[j] ) == abs( best_spec[j] ) && lspec[j] > best_spec[j] ) )
      {
        update_best( lspec );
        return;
      }

      if ( abs( lspec[j] ) < abs( best_spec[j] ) ||
           ( abs( lspec[j] ) == abs( best_spec[j] ) && lspec[j] < best_spec[j] ) )
      {
        return;
      }
    }

    if ( transformation_costs( transforms ) < transformation_costs( best_transforms ) )
    {
      update_best( lspec );
    }
  }